

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::filterMember
          (TGlslangToSpvTraverser *this,TType *member)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  const_iterator cVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  allocator<char> local_51;
  key_type local_50;
  
  pTVar1 = this->glslangIntermediate;
  this_00 = &pTVar1->requestedExtensions;
  iVar3 = (*member->_vptr_TType[6])(member);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar3),"gl_SecondaryViewportMaskNV");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GL_NV_stereo_view_rendering",&local_51);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_50);
    std::__cxx11::string::_M_dispose();
    if ((_Rb_tree_header *)cVar4._M_node !=
        &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bf9cd;
LAB_003bfbd7:
    bVar2 = true;
  }
  else {
LAB_003bf9cd:
    iVar3 = (*member->_vptr_TType[6])(member);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_00,iVar3),"gl_SecondaryPositionNV");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"GL_NV_stereo_view_rendering",&local_51);
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_50);
      std::__cxx11::string::_M_dispose();
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bfbd7;
    }
    if (this->glslangIntermediate->language == EShLangMesh) {
      iVar3 = (*member->_vptr_TType[6])(member);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_01,iVar3),"gl_PrimitiveShadingRateEXT");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"GL_EXT_fragment_shading_rate",&local_51);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,&local_50);
        std::__cxx11::string::_M_dispose();
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bfbd7;
      }
    }
    if (this->glslangIntermediate->language != EShLangMesh) {
      iVar3 = (*member->_vptr_TType[6])(member);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_02,iVar3),"gl_ViewportMask");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"GL_NV_viewport_array2",&local_51);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,&local_50);
        std::__cxx11::string::_M_dispose();
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bfbd7;
      }
      iVar3 = (*member->_vptr_TType[6])(member);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_03,iVar3),"gl_PositionPerViewNV");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"GL_NVX_multiview_per_view_attributes",&local_51);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,&local_50);
        std::__cxx11::string::_M_dispose();
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bfbd7;
      }
      iVar3 = (*member->_vptr_TType[6])(member);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_04,iVar3),"gl_ViewportMaskPerViewNV");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"GL_NVX_multiview_per_view_attributes",&local_51);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,&local_50);
        std::__cxx11::string::_M_dispose();
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) goto LAB_003bfbd7;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TGlslangToSpvTraverser::filterMember(const glslang::TType& member)
{
    auto& extensions = glslangIntermediate->getRequestedExtensions();

    if (member.getFieldName() == "gl_SecondaryViewportMaskNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;
    if (member.getFieldName() == "gl_SecondaryPositionNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;

    if (glslangIntermediate->getStage() == EShLangMesh) {
        if (member.getFieldName() == "gl_PrimitiveShadingRateEXT" &&
            extensions.find("GL_EXT_fragment_shading_rate") == extensions.end())
            return true;
    }

    if (glslangIntermediate->getStage() != EShLangMesh) {
        if (member.getFieldName() == "gl_ViewportMask" &&
            extensions.find("GL_NV_viewport_array2") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_PositionPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_ViewportMaskPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
    }

    return false;
}